

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

HelicsFederate helicsFederateClone(HelicsFederate fed,HelicsError *err)

{
  FedObject *pFVar1;
  HelicsFederate pvVar2;
  __shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  pFVar1 = helics::getFedObject(fed,err);
  if (pFVar1 == (FedObject *)0x0) {
    pvVar2 = (HelicsFederate)0x0;
  }
  else {
    std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_20,
               &(pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>);
    pvVar2 = generateNewHelicsFederateObject((shared_ptr<helics::Federate> *)&local_20,pFVar1->type)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  }
  return pvVar2;
}

Assistant:

HelicsFederate helicsFederateClone(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    return generateNewHelicsFederateObject(fedObj->fedptr, fedObj->type);
}